

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kitIsop.c
# Opt level: O3

int Kit_TruthIsop(uint *puTruth,int nVars,Vec_Int_t *vMemory,int fTryBoth)

{
  uint uVar1;
  long lVar2;
  long lVar3;
  int *piVar4;
  uint *puVar5;
  ulong uVar6;
  ulong uVar7;
  int iVar8;
  Kit_Sop_t *pcRes;
  Kit_Sop_t cRes;
  Kit_Sop_t cRes2;
  Kit_Sop_t local_50;
  Kit_Sop_t local_40;
  
  if (0x10 < (uint)nVars) {
    __assert_fail("nVars >= 0 && nVars <= 16",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/bool/kit/kitIsop.c"
                  ,0x3d,"int Kit_TruthIsop(unsigned int *, int, Vec_Int_t *, int)");
  }
  vMemory->nSize = 0;
  if (vMemory->nCap < 0x100000) {
    if (vMemory->pArray == (int *)0x0) {
      piVar4 = (int *)malloc(0x400000);
    }
    else {
      piVar4 = (int *)realloc(vMemory->pArray,0x400000);
    }
    vMemory->pArray = piVar4;
    if (piVar4 == (int *)0x0) {
      __assert_fail("p->pArray",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                    ,0x20c,"void Vec_IntGrow(Vec_Int_t *, int)");
    }
    vMemory->nCap = 0x100000;
  }
  pcRes = &local_50;
  puVar5 = Kit_TruthIsop_rec(puTruth,puTruth,nVars,pcRes,vMemory);
  if (local_50.nCubes == -1) {
    local_50.nCubes = -1;
    iVar8 = -1;
  }
  else {
    uVar1 = 1 << ((char)nVars - 5U & 0x1f);
    if ((uint)nVars < 6) {
      uVar1 = 1;
    }
    uVar7 = (ulong)uVar1;
    uVar6 = uVar7;
    while (0 < (long)uVar6) {
      lVar2 = uVar6 - 1;
      lVar3 = uVar6 - 1;
      uVar6 = uVar6 - 1;
      if (puTruth[lVar2] != puVar5[lVar3]) {
        __assert_fail("Kit_TruthIsEqual( puTruth, pResult, nVars )",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/bool/kit/kitIsop.c"
                      ,0x4b,"int Kit_TruthIsop(unsigned int *, int, Vec_Int_t *, int)");
      }
    }
    if ((local_50.nCubes == 0) || ((local_50.nCubes == 1 && (*local_50.pCubes == 0)))) {
      *vMemory->pArray = 0;
      iVar8 = 0;
    }
    else {
      if (fTryBoth == 0) {
        iVar8 = 0;
      }
      else {
        uVar6 = uVar7 + 1;
        do {
          puTruth[uVar6 - 2] = ~puTruth[uVar6 - 2];
          uVar6 = uVar6 - 1;
        } while (1 < uVar6);
        puVar5 = Kit_TruthIsop_rec(puTruth,puTruth,nVars,&local_40,vMemory);
        iVar8 = 0;
        pcRes = &local_50;
        uVar6 = uVar7;
        if (-1 < local_40.nCubes) {
          while (0 < (long)uVar6) {
            lVar2 = uVar6 - 1;
            lVar3 = uVar6 - 1;
            uVar6 = uVar6 - 1;
            if (puTruth[lVar2] != puVar5[lVar3]) {
              __assert_fail("Kit_TruthIsEqual( puTruth, pResult, nVars )",
                            "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/bool/kit/kitIsop.c"
                            ,0x59,"int Kit_TruthIsop(unsigned int *, int, Vec_Int_t *, int)");
            }
          }
          if ((local_40.nCubes < local_50.nCubes) ||
             ((local_50.nCubes == local_40.nCubes && (local_40.nLits < local_50.nLits)))) {
            iVar8 = 1;
            pcRes = &local_40;
          }
        }
        uVar7 = uVar7 + 1;
        do {
          puTruth[uVar7 - 2] = ~puTruth[uVar7 - 2];
          uVar7 = uVar7 - 1;
        } while (1 < uVar7);
        local_50.nCubes = pcRes->nCubes;
      }
      memmove(vMemory->pArray,pcRes->pCubes,(long)local_50.nCubes << 2);
      local_50.nCubes = pcRes->nCubes;
    }
    if (vMemory->nSize < local_50.nCubes) {
      __assert_fail("p->nSize >= nSizeNew",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                    ,0x2ac,"void Vec_IntShrink(Vec_Int_t *, int)");
    }
  }
  vMemory->nSize = local_50.nCubes;
  return iVar8;
}

Assistant:

int Kit_TruthIsop( unsigned * puTruth, int nVars, Vec_Int_t * vMemory, int fTryBoth )
{
    Kit_Sop_t cRes, * pcRes = &cRes;
    Kit_Sop_t cRes2, * pcRes2 = &cRes2;
    unsigned * pResult;
    int RetValue = 0;
    assert( nVars >= 0 && nVars <= 16 );
    // if nVars < 5, make sure it does not depend on those vars
//    for ( i = nVars; i < 5; i++ )
//        assert( !Kit_TruthVarInSupport(puTruth, 5, i) );
    // prepare memory manager
    Vec_IntClear( vMemory );
    Vec_IntGrow( vMemory, KIT_ISOP_MEM_LIMIT );
    // compute ISOP for the direct polarity
    pResult = Kit_TruthIsop_rec( puTruth, puTruth, nVars, pcRes, vMemory );
    if ( pcRes->nCubes == -1 )
    {
        vMemory->nSize = -1;
        return -1;
    }
    assert( Kit_TruthIsEqual( puTruth, pResult, nVars ) );
    if ( pcRes->nCubes == 0 || (pcRes->nCubes == 1 && pcRes->pCubes[0] == 0) )
    {
        vMemory->pArray[0] = 0;
        Vec_IntShrink( vMemory, pcRes->nCubes );
        return 0;
    }
    if ( fTryBoth )
    {
        // compute ISOP for the complemented polarity
        Kit_TruthNot( puTruth, puTruth, nVars );
        pResult = Kit_TruthIsop_rec( puTruth, puTruth, nVars, pcRes2, vMemory );
        if ( pcRes2->nCubes >= 0 )
        {
            assert( Kit_TruthIsEqual( puTruth, pResult, nVars ) );
            if ( pcRes->nCubes > pcRes2->nCubes || (pcRes->nCubes == pcRes2->nCubes && pcRes->nLits > pcRes2->nLits) )
            {
                RetValue = 1;
                pcRes = pcRes2;
            }
        }
        Kit_TruthNot( puTruth, puTruth, nVars );
    }
//    printf( "%d ", vMemory->nSize );
    // move the cover representation to the beginning of the memory buffer
    memmove( vMemory->pArray, pcRes->pCubes, pcRes->nCubes * sizeof(unsigned) );
    Vec_IntShrink( vMemory, pcRes->nCubes );
    return RetValue;
}